

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

void __thiscall leveldb::MemTable::~MemTable(MemTable *this)

{
  MemTable *this_local;
  
  if (this->refs_ == 0) {
    SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::~SkipList(&this->table_);
    Arena::~Arena(&this->arena_);
    KeyComparator::~KeyComparator(&this->comparator_);
    return;
  }
  __assert_fail("refs_ == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/memtable.cc"
                ,0x18,"leveldb::MemTable::~MemTable()");
}

Assistant:

MemTable::~MemTable() { assert(refs_ == 0); }